

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupLayer(CEditor *this,void *pContext,CUIRect View)

{
  uint uVar1;
  CLayer *pCVar2;
  CLayerGroup *this_00;
  bool bVar3;
  int iVar4;
  CLayer *pCVar5;
  CLayer *pCVar6;
  long in_FS_OFFSET;
  int NewVal;
  CUIRect Button;
  CLayer *pCurrentLayer;
  CProperty aProps [4];
  int local_c4;
  CUIRect local_c0;
  CLayer *local_b0;
  CUIRect local_a8;
  CProperty local_98;
  char *local_80;
  int local_78;
  undefined8 local_74;
  int local_6c;
  char *local_68;
  uint local_60;
  ulong local_5c;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = View;
  pCVar5 = GetSelectedLayer(this,0);
  pCVar2 = (CLayer *)(this->m_Map).m_pGameLayer;
  local_b0 = pCVar5;
  CUIRect::HSplitBottom(&local_a8,12.0,&local_a8,&local_c0);
  pCVar6 = pCVar5;
  if (pCVar2 != pCVar5) {
    iVar4 = DoButton_Editor(this,&PopupLayer::s_DeleteButton,"Delete layer",0,&local_c0,0,
                            "Deletes the layer");
    if (iVar4 != 0) {
      CLayerGroup::DeleteLayer
                ((this->m_Map).m_lGroups.list[this->m_SelectedGroup],this->m_SelectedLayer);
      bVar3 = true;
      goto LAB_001a8d9b;
    }
    CUIRect::HSplitBottom(&local_a8,5.0,&local_a8,&local_c0);
    CUIRect::HSplitBottom(&local_a8,16.0,&local_a8,&local_c0);
    CUI::DoLabel(&this->m_UI,&local_c0,"Name:",10.0,0,-1.0,true);
    CUIRect::VSplitLeft(&local_c0,40.0,(CUIRect *)0x0,&local_c0);
    if ((PopupLayer(void*,CUIRect)::s_NameInput == '\0') &&
       (iVar4 = __cxa_guard_acquire(&PopupLayer(void*,CUIRect)::s_NameInput), iVar4 != 0)) {
      CLineInput::CLineInput(&PopupLayer::s_NameInput);
      __cxa_atexit(CLineInput::~CLineInput,&PopupLayer::s_NameInput,&__dso_handle);
      __cxa_guard_release(&PopupLayer(void*,CUIRect)::s_NameInput);
    }
    pCVar6 = local_b0;
    CLineInput::SetBuffer(&PopupLayer::s_NameInput,local_b0->m_aName,0xc,0xc);
    bVar3 = CUI::DoEditBox(&this->m_UI,&PopupLayer::s_NameInput,&local_c0,10.0,0xf,
                           &LightButtonColorFunction.super_IButtonColorFunction);
    if (bVar3) {
      (this->m_Map).m_Modified = true;
    }
  }
  CUIRect::HSplitBottom(&local_a8,10.0,&local_a8,(CUIRect *)0x0);
  local_98.m_Value = this->m_SelectedGroup;
  this_00 = (this->m_Map).m_lGroups.list[local_98.m_Value];
  local_98.m_pName = "Group";
  local_98.m_Type = 2;
  local_98.m_Min = 0;
  local_98.m_Max = (this->m_Map).m_lGroups.num_elements + -1;
  local_80 = "Order";
  local_78 = this->m_SelectedLayer;
  local_74 = 2;
  local_6c = (this_00->m_lLayers).num_elements;
  local_68 = "Detail";
  local_60 = pCVar6->m_Flags & 1;
  local_54 = 1;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  if (pCVar2 == pCVar5) {
    local_98.m_Type = 0;
    local_98.m_Min = 0;
  }
  local_5c = (ulong)(pCVar2 != pCVar5);
  local_c4 = 0;
  iVar4 = DoProperties(this,&local_a8,&local_98,PopupLayer::s_aIds,&local_c4);
  if (iVar4 != -1) {
    (this->m_Map).m_Modified = true;
    if (iVar4 == 0) {
      if (((pCVar2 != pCVar5) && (-1 < local_c4)) &&
         (local_c4 < (this->m_Map).m_lGroups.num_elements)) {
        array<CLayer_*,_allocator_default<CLayer_*>_>::remove(&this_00->m_lLayers,(char *)&local_b0)
        ;
        array<CLayer_*,_allocator_default<CLayer_*>_>::add
                  (&(this->m_Map).m_lGroups.list[local_c4]->m_lLayers,&local_b0);
        this->m_SelectedGroup = local_c4;
        this->m_SelectedLayer =
             ((this->m_Map).m_lGroups.list[local_c4]->m_lLayers).num_elements + -1;
        pCVar6 = local_b0;
      }
    }
    else if (iVar4 == 2) {
      uVar1 = pCVar6->m_Flags;
      pCVar6->m_Flags = uVar1 & 0xfffffffe;
      if (local_c4 != 0) {
        pCVar6->m_Flags = uVar1 | 1;
      }
    }
    else if (iVar4 == 1) {
      iVar4 = CLayerGroup::SwapLayers(this_00,this->m_SelectedLayer,local_c4);
      this->m_SelectedLayer = iVar4;
    }
  }
  iVar4 = (*pCVar6->_vptr_CLayer[0xb])(pCVar6,&local_a8);
  bVar3 = iVar4 != 0;
LAB_001a8d9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CEditor::PopupLayer(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayer *pCurrentLayer = pEditor->GetSelectedLayer(0);
	bool IsGameLayer = pEditor->m_Map.m_pGameLayer == pCurrentLayer;

	// remove layer button
	CUIRect Button;
	View.HSplitBottom(12.0f, &View, &Button);
	static int s_DeleteButton = 0;

	// don't allow deletion of game layer
	if(!IsGameLayer && pEditor->DoButton_Editor(&s_DeleteButton, "Delete layer", 0, &Button, 0, "Deletes the layer"))
	{
		pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup]->DeleteLayer(pEditor->m_SelectedLayer);
		return true;
	}

	// layer name
	if(!IsGameLayer)
	{
		View.HSplitBottom(5.0f, &View, &Button);
		View.HSplitBottom(16.0f, &View, &Button);
		pEditor->UI()->DoLabel(&Button, "Name:", 10.0f, TEXTALIGN_LEFT);
		Button.VSplitLeft(40.0f, 0, &Button);
		static CLineInput s_NameInput;
		s_NameInput.SetBuffer(pCurrentLayer->m_aName, sizeof(pCurrentLayer->m_aName));
		if(pEditor->DoEditBox(&s_NameInput, &Button, 10.0f))
			pEditor->m_Map.m_Modified = true;
	}

	View.HSplitBottom(10.0f, &View, 0);

	CLayerGroup *pCurrentGroup = pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup];

	enum
	{
		PROP_GROUP=0,
		PROP_ORDER,
		PROP_HQ,
		NUM_PROPS,
	};

	CProperty aProps[] = {
		{"Group", pEditor->m_SelectedGroup, PROPTYPE_INT_STEP, 0, pEditor->m_Map.m_lGroups.size()-1},
		{"Order", pEditor->m_SelectedLayer, PROPTYPE_INT_STEP, 0, pCurrentGroup->m_lLayers.size()},
		{"Detail", pCurrentLayer->m_Flags&LAYERFLAG_DETAIL, PROPTYPE_BOOL, 0, 1},
		{0},
	};

	if(IsGameLayer) // dont use Group and Detail from the selection if this is the game layer
	{
		aProps[0].m_Type = PROPTYPE_NULL;
		aProps[2].m_Type = PROPTYPE_NULL;
	}

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_ORDER)
		pEditor->m_SelectedLayer = pCurrentGroup->SwapLayers(pEditor->m_SelectedLayer, NewVal);
	else if(Prop == PROP_GROUP && !IsGameLayer)
	{
		if(NewVal >= 0 && NewVal < pEditor->m_Map.m_lGroups.size())
		{
			pCurrentGroup->m_lLayers.remove(pCurrentLayer);
			pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.add(pCurrentLayer);
			pEditor->m_SelectedGroup = NewVal;
			pEditor->m_SelectedLayer = pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.size()-1;
		}
	}
	else if(Prop == PROP_HQ)
	{
		pCurrentLayer->m_Flags &= ~LAYERFLAG_DETAIL;
		if(NewVal)
			pCurrentLayer->m_Flags |= LAYERFLAG_DETAIL;
	}

	return pCurrentLayer->RenderProperties(&View);
}